

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tests.cpp
# Opt level: O0

vector<uint256,_std::allocator<uint256>_> *
merkle_tests::BlockMerkleBranch(CBlock *block,uint32_t position)

{
  long lVar1;
  size_type sVar2;
  reference pvVar3;
  vector<uint256,_std::allocator<uint256>_> *in_RDI;
  long in_FS_OFFSET;
  size_t s;
  vector<uint256,_std::allocator<uint256>_> leaves;
  CTransaction *in_stack_ffffffffffffff78;
  uint256 *in_stack_ffffffffffffff80;
  Txid *in_stack_ffffffffffffff88;
  size_type in_stack_ffffffffffffff90;
  ulong uVar4;
  vector<uint256,_std::allocator<uint256>_> *leaves_00;
  ulong local_50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  leaves_00 = in_RDI;
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff78);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *)in_stack_ffffffffffffff78);
  std::vector<uint256,_std::allocator<uint256>_>::resize(in_RDI,in_stack_ffffffffffffff90);
  local_50 = 0;
  while( true ) {
    uVar4 = local_50;
    sVar2 = std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)in_stack_ffffffffffffff78);
    if (sVar2 <= uVar4) break;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_ffffffffffffff88,(size_type)in_stack_ffffffffffffff80);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff88 = CTransaction::GetHash(in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff80 =
         transaction_identifier::operator_cast_to_uint256_
                   ((transaction_identifier<false> *)in_stack_ffffffffffffff78);
    pvVar3 = std::vector<uint256,_std::allocator<uint256>_>::operator[]
                       ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff88,
                        (size_type)in_stack_ffffffffffffff80);
    *(undefined8 *)(pvVar3->super_base_blob<256U>).m_data._M_elems =
         *(undefined8 *)(in_stack_ffffffffffffff80->super_base_blob<256U>).m_data._M_elems;
    *(undefined8 *)((pvVar3->super_base_blob<256U>).m_data._M_elems + 8) =
         *(undefined8 *)((in_stack_ffffffffffffff80->super_base_blob<256U>).m_data._M_elems + 8);
    *(undefined8 *)((pvVar3->super_base_blob<256U>).m_data._M_elems + 0x10) =
         *(undefined8 *)((in_stack_ffffffffffffff80->super_base_blob<256U>).m_data._M_elems + 0x10);
    *(undefined8 *)((pvVar3->super_base_blob<256U>).m_data._M_elems + 0x18) =
         *(undefined8 *)((in_stack_ffffffffffffff80->super_base_blob<256U>).m_data._M_elems + 0x18);
    local_50 = local_50 + 1;
  }
  ComputeMerkleBranch(leaves_00,(uint32_t)((ulong)in_RDI >> 0x20));
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return leaves_00;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<uint256> BlockMerkleBranch(const CBlock& block, uint32_t position)
{
    std::vector<uint256> leaves;
    leaves.resize(block.vtx.size());
    for (size_t s = 0; s < block.vtx.size(); s++) {
        leaves[s] = block.vtx[s]->GetHash();
    }
    return ComputeMerkleBranch(leaves, position);
}